

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectAppearance.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::LinearObjectAppearance::SetOpacity(LinearObjectAppearance *this,KUINT8 O)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (O < 0x65) {
    (this->super_ObjectAppearance).field_0xc = O;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"SetOpacity",&local_39);
  KException::KException<char_const*>(this_00,&local_38,8,"Acceptable values are 0-100.");
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LinearObjectAppearance::SetOpacity(KUINT8 O) noexcept(false)
{
    if( O > 100 ) throw KException( __FUNCTION__, INVALID_DATA, "Acceptable values are 0-100." );

    m_SpecificAppearanceUnion.m_ExhaustSmoke.m_ui32Opacity = O;
}